

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

PClassActor * T_GetMobjType(svalue_t *arg)

{
  uint uVar1;
  PClassActor *pPVar2;
  AActor *this;
  
  if (arg->type == 2) {
    this = actorvalue(arg);
    if (this != (AActor *)0x0) {
      pPVar2 = (PClassActor *)DObject::GetClass((DObject *)this);
      return pPVar2;
    }
    pPVar2 = (PClassActor *)0x0;
  }
  else if (arg->type == 0) {
    pPVar2 = PClass::FindActor(&arg->string);
    if (pPVar2 == (PClassActor *)0x0) {
      pPVar2 = (PClassActor *)0x0;
      script_error("unknown object type: %s\n",(arg->string).Chars);
    }
  }
  else {
    uVar1 = intvalue(arg);
    if ((0x8a < uVar1) || (pPVar2 = ActorTypes[uVar1], pPVar2 == (PClassActor *)0x0)) {
      pPVar2 = (PClassActor *)0x0;
      script_error("unknown object type: %i\n",(ulong)uVar1);
    }
  }
  return pPVar2;
}

Assistant:

PClassActor * T_GetMobjType(svalue_t arg)
{
	PClassActor * pclass=NULL;
	
	if (arg.type==svt_string)
	{
		pclass=PClass::FindActor(arg.string);

		// invalid object to spawn
		if(!pclass) script_error("unknown object type: %s\n", arg.string.GetChars()); 
	}
	else if (arg.type==svt_mobj)
	{
		AActor * mo = actorvalue(arg);
		if (mo) pclass = mo->GetClass();
	}
	else
	{
		int objtype = intvalue(arg);
		if (objtype>=0 && objtype<int(countof(ActorTypes))) pclass=ActorTypes[objtype];
		else pclass=NULL;

		// invalid object to spawn
		if(!pclass) script_error("unknown object type: %i\n", objtype); 
	}
	return pclass;
}